

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int read_chars(lua_State *L,FILE *f,size_t n)

{
  char *__ptr;
  size_t sVar1;
  bool local_2052;
  bool local_2051;
  char *p;
  luaL_Buffer b;
  size_t nr;
  size_t rlen;
  size_t n_local;
  FILE *f_local;
  lua_State *L_local;
  
  luaL_buffinit(L,(luaL_Buffer *)&p);
  nr = 0x2000;
  rlen = n;
  do {
    __ptr = luaL_prepbuffer((luaL_Buffer *)&p);
    if (rlen < nr) {
      nr = rlen;
    }
    b.buffer._8184_8_ = fread(__ptr,1,nr,(FILE *)f);
    p = p + b.buffer._8184_8_;
    rlen = rlen - b.buffer._8184_8_;
    local_2051 = rlen != 0 && b.buffer._8184_8_ == nr;
  } while (local_2051);
  luaL_pushresult((luaL_Buffer *)&p);
  local_2052 = true;
  if (rlen != 0) {
    sVar1 = lua_objlen(L,-1);
    local_2052 = sVar1 != 0;
  }
  return (int)local_2052;
}

Assistant:

static int read_chars(lua_State*L,FILE*f,size_t n){
size_t rlen;
size_t nr;
luaL_Buffer b;
luaL_buffinit(L,&b);
rlen=BUFSIZ;
do{
char*p=luaL_prepbuffer(&b);
if(rlen>n)rlen=n;
nr=fread(p,sizeof(char),rlen,f);
luaL_addsize(&b,nr);
n-=nr;
}while(n>0&&nr==rlen);
luaL_pushresult(&b);
return(n==0||lua_objlen(L,-1)>0);
}